

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxMemberIdentifier::Resolve(FxMemberIdentifier *this,FCompileContext *ctx)

{
  FxExpression **object;
  FScriptPosition *this_00;
  FxExpression *pFVar1;
  PType *pPVar2;
  PClass *pPVar3;
  int iVar4;
  PStruct *pPVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PSymbol *sym;
  undefined4 extraout_var_01;
  undefined8 uVar6;
  PClass *pPVar7;
  undefined4 extraout_var_02;
  FxMemberIdentifier *pFVar8;
  undefined4 extraout_var_03;
  PClass *pPVar9;
  FxMemberIdentifier *unaff_R13;
  bool bVar10;
  FName local_38;
  FName local_34;
  
  if ((this->super_FxIdentifier).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxIdentifier).super_FxExpression.isresolved = true;
  object = &this->Object;
  if (this->Object->ExprType == EFX_Identifier) {
    local_34.Index = *(int *)&this->Object[1]._vptr_FxExpression;
    pPVar5 = FindStructType(&local_34);
    if (pPVar5 == (PStruct *)0x0) goto LAB_0053228e;
    *(undefined1 *)((long)&(*object)[1]._vptr_FxExpression + 4) = 1;
  }
  else {
LAB_0053228e:
    pPVar5 = (PStruct *)0x0;
  }
  pFVar1 = *object;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar4 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
    *object = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  if (*object == (FxExpression *)0x0) {
    pFVar8 = (FxMemberIdentifier *)0x0;
  }
  else {
    FName::NameManager::FindName(&FName::NameData,"allmap",false);
    pPVar9 = PClass::RegistrationInfo.MyClass;
    if ((pPVar5 != (PStruct *)0x0) && (this->Object->ValueType == &TypeError->super_PType)) {
      if ((pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
          Class == (PClass *)0x0) {
        iVar4 = (**(pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                   super_DObject._vptr_DObject)(pPVar5);
        (pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      pPVar7 = (pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
               super_DObject.Class;
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar9 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar9) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((!bVar10) ||
         (*(char *)((long)&pPVar5[1].super_PNamedType.super_PCompoundType.super_PType.HashNext + 1)
          == '\x01')) {
        local_38.Index = (this->super_FxIdentifier).Identifier.Index;
        sym = PSymbolTable::FindSymbol
                        (&(pPVar5->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                         &local_38,true);
        pPVar9 = PSymbolConst::RegistrationInfo.MyClass;
        if (sym != (PSymbol *)0x0) {
          if ((sym->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
            iVar4 = (**(sym->super_PTypeBase).super_DObject._vptr_DObject)(sym);
            (sym->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar4);
          }
          pPVar7 = (sym->super_PTypeBase).super_DObject.Class;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar9 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar9) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          this_00 = &(this->super_FxIdentifier).super_FxExpression.ScriptPosition;
          if (bVar10) {
            FScriptPosition::Message
                      (this_00,8,"Resolving name \'%s.%s\' as constant\n",
                       FName::NameData.NameArray[(pPVar5->super_PNamedType).TypeName.Index].Text,
                       FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
            (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
            unaff_R13 = (FxMemberIdentifier *)FxConstant::MakeConstant(sym,this_00);
          }
          else {
            unaff_R13 = (FxMemberIdentifier *)0x0;
            FScriptPosition::Message
                      (this_00,2,"Unable to access \'%s.%s\' in a static context\n",
                       FName::NameData.NameArray[(pPVar5->super_PNamedType).TypeName.Index].Text,
                       FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
            (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
          }
        }
        if (sym != (PSymbol *)0x0) {
          return (FxExpression *)unaff_R13;
        }
      }
    }
    pPVar9 = PPointer::RegistrationInfo.MyClass;
    pPVar2 = (*object)->ValueType;
    if (pPVar2 == (PType *)TypeColor) {
      (*object)->ValueType = (PType *)TypeColorStruct;
    }
    else {
      if (*(long *)(&((PInt *)&pPVar2->super_PTypeBase)->field_0x0 + 8) == 0) {
        uVar6 = (*(code *)**(undefined8 **)&pPVar2->super_PTypeBase)(pPVar2);
        *(undefined8 *)(&((PInt *)&pPVar2->super_PTypeBase)->field_0x0 + 8) = uVar6;
      }
      pPVar3 = PStruct::RegistrationInfo.MyClass;
      pPVar7 = *(PClass **)(&((PInt *)&pPVar2->super_PTypeBase)->field_0x0 + 8);
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar9 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar9) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      pPVar2 = (*object)->ValueType;
      if (bVar10) {
        pPVar5 = (PStruct *)pPVar2[1].super_PTypeBase.super_DObject._vptr_DObject;
        if ((pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject
            .Class == (PClass *)0x0) {
          iVar4 = (**(pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                     super_DObject._vptr_DObject)(pPVar5);
          (pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
          Class = (PClass *)CONCAT44(extraout_var_02,iVar4);
        }
        pPVar9 = (pPVar5->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                 super_DObject.Class;
        bVar10 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar3 && bVar10) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar10 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar3) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (bVar10) {
          pFVar8 = (FxMemberIdentifier *)
                   FxIdentifier::ResolveMember
                             (&this->super_FxIdentifier,ctx,ctx->Class,object,pPVar5);
          (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
          return (FxExpression *)pFVar8;
        }
      }
      else {
        if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
          (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_03,iVar4);
        }
        pPVar9 = (pPVar2->super_PTypeBase).super_DObject.Class;
        bVar10 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar3 && bVar10) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar10 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar3) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (bVar10) {
          pFVar8 = (FxMemberIdentifier *)
                   FxIdentifier::ResolveMember
                             (&this->super_FxIdentifier,ctx,ctx->Class,object,
                              (PStruct *)this->Object->ValueType);
          goto LAB_00532609;
        }
      }
    }
    pFVar8 = (FxMemberIdentifier *)0x0;
    FScriptPosition::Message
              (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,2,
               "Left side of %s is not a struct or class",
               FName::NameData.NameArray[(this->super_FxIdentifier).Identifier.Index].Text);
  }
LAB_00532609:
  (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)pFVar8;
}

Assistant:

FxExpression *FxMemberIdentifier::Resolve(FCompileContext& ctx)
{
	PStruct *ccls = nullptr;
	CHECKRESOLVED();

	if (Object->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Object)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Object)->noglobal = true;
	}

	SAFE_RESOLVE(Object, ctx);

	if (Identifier == FName("allmap"))
	{
		int a = 2;
	}

	// check for class or struct constants if the left side is a type name.
	if (Object->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				PSymbol *sym;
				if ((sym = ccls->Symbols.FindSymbol(Identifier, true)) != nullptr)
				{
					if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
					{
						ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s.%s' as constant\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return FxConstant::MakeConstant(sym, ScriptPosition);
					}
					else
					{
						ScriptPosition.Message(MSG_ERROR, "Unable to access '%s.%s' in a static context\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return nullptr;
					}
				}
			}
		}
	}

	// allow accessing the color channels by mapping the type to a matching struct which defines them.
	if (Object->ValueType == TypeColor)
	{
		Object->ValueType = TypeColorStruct;
	}

	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Object->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(ptype));
			delete this;
			return ret;
		}
	}
	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(Object->ValueType));
		delete this;
		return ret;
	}

	ScriptPosition.Message(MSG_ERROR, "Left side of %s is not a struct or class", Identifier.GetChars());
	delete this;
	return nullptr;
}